

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O0

int tok_scan_defsym(tokcxdef *ctx,char *p,int len)

{
  ushort **ppuVar1;
  int in_EDX;
  byte *in_RSI;
  bool bVar2;
  int symlen;
  undefined6 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffde;
  undefined1 in_stack_ffffffffffffffdf;
  undefined4 in_stack_ffffffffffffffe0;
  byte *local_18;
  int local_4;
  
  ppuVar1 = __ctype_b_loc();
  if (((((*ppuVar1)[(int)(uint)*in_RSI] & 0x400) == 0) && (*in_RSI != 0x5f)) && (*in_RSI != 0x24)) {
    errlogf((errcxdef *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
            (char *)CONCAT17(in_stack_ffffffffffffffdf,
                             CONCAT16(in_stack_ffffffffffffffde,in_stack_ffffffffffffffd8)),0);
    local_4 = 0;
  }
  else {
    local_4 = 0;
    local_18 = in_RSI;
    while( true ) {
      bVar2 = false;
      if (in_EDX != 0) {
        ppuVar1 = __ctype_b_loc();
        bVar2 = true;
        if (((*ppuVar1)[(int)(uint)*local_18] & 0x400) == 0) {
          ppuVar1 = __ctype_b_loc();
          bVar2 = true;
          if ((((*ppuVar1)[(int)(uint)*local_18] & 0x800) == 0) && (bVar2 = true, *local_18 != 0x5f)
             ) {
            bVar2 = *local_18 == 0x24;
          }
        }
      }
      if (!bVar2) break;
      local_18 = local_18 + 1;
      in_EDX = in_EDX + -1;
      local_4 = local_4 + 1;
    }
  }
  return local_4;
}

Assistant:

static int tok_scan_defsym(tokcxdef *ctx, char *p, int len)
{
    int symlen;

    /* make sure it's a valid symbol */
    if (!(isalpha((uchar)*p) || *p == '_' || *p == '$'))
    {
        errlog(ctx->tokcxerr, ERR_REQSYM);
        return 0;
    }

    /* count characters as long as we have valid symbol characters */
    for (symlen = 0 ; len && TOKISSYM(*p) ; ++p, --len, ++symlen) ;
    return symlen;
}